

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  char *text;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ImVec2 IVar9;
  float fVar10;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentTable;
  fVar10 = GImGui->FontSize;
  if (0 < pIVar2->ColumnsCount) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (((pIVar2->EnabledMaskByIndex[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) != 0) &&
         (pIVar3 = (pIVar2->Columns).Data, (*(byte *)((long)&pIVar3->Flags + lVar7 + 1) & 0x10) == 0
         )) {
        if ((pIVar2->IsLayoutLocked != false) ||
           (text = "", (long)uVar6 < (long)pIVar2->DeclColumnsCount)) {
          lVar5 = (long)*(short *)((long)&pIVar3->NameOffset + lVar7);
          text = "";
          if (lVar5 != -1) {
            text = (pIVar2->ColumnsNames).Buf.Data + lVar5;
          }
        }
        IVar9 = CalcTextSize(text,(char *)0x0,false,-1.0);
        uVar8 = -(uint)(IVar9.y <= fVar10);
        fVar10 = (float)(uVar8 & (uint)fVar10 | ~uVar8 & (uint)IVar9.y);
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x70;
    } while ((long)uVar6 < (long)pIVar2->ColumnsCount);
  }
  fVar1 = (pIVar4->Style).CellPadding.y;
  return fVar1 + fVar1 + fVar10;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    float row_height = g.FontSize;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
            if ((table->Columns[column_n].Flags & ImGuiTableColumnFlags_NoHeaderLabel) == 0)
                row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(table, column_n)).y);
    return row_height + g.Style.CellPadding.y * 2.0f;
}